

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl.c
# Opt level: O0

avl_node * avl_find(avl_tree *tree,void *key)

{
  avl_node *local_38;
  int local_2c [2];
  int diff;
  avl_node *node;
  void *key_local;
  avl_tree *tree_local;
  
  if (tree->root == (avl_node *)0x0) {
    tree_local = (avl_tree *)0x0;
  }
  else {
    node = (avl_node *)key;
    key_local = tree;
    local_38 = _avl_find_rec(tree->root,key,tree->comp,local_2c);
    if (local_2c[0] != 0) {
      local_38 = (avl_node *)0x0;
    }
    tree_local = (avl_tree *)local_38;
  }
  return (avl_node *)tree_local;
}

Assistant:

struct avl_node *
avl_find(const struct avl_tree *tree, const void *key) {
  struct avl_node *node;
  int diff;

  if (tree->root == NULL)
    return NULL;

  node = _avl_find_rec(tree->root, key, tree->comp, &diff);

  return diff == 0 ? node : NULL;
}